

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::BeginFunctionBody
          (BinaryReaderIR *this,Index index,Offset size)

{
  State *pSVar1;
  Func *pFVar2;
  char *__s;
  Offset OVar3;
  Result RVar4;
  size_t sVar5;
  
  pSVar1 = (this->super_BinaryReaderNop).super_BinaryReaderDelegate.state;
  pFVar2 = (this->module_->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
           _M_impl.super__Vector_impl_data._M_start[index];
  this->current_func_ = pFVar2;
  __s = this->filename_;
  OVar3 = pSVar1->offset;
  sVar5 = strlen(__s);
  (pFVar2->loc).filename._M_len = sVar5;
  (pFVar2->loc).filename._M_str = __s;
  (pFVar2->loc).field_1.field_1.offset = OVar3;
  (pFVar2->loc).field_1.field_0.last_column = 0;
  RVar4 = PushLabel(this,First,&this->current_func_->exprs,(Expr *)0x0);
  return (Result)RVar4.enum_;
}

Assistant:

Result BinaryReaderIR::BeginFunctionBody(Index index, Offset size) {
  current_func_ = module_->funcs[index];
  current_func_->loc = GetLocation();
  return PushLabel(LabelType::Func, &current_func_->exprs);
}